

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::Quoted_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoGen *this,string_view text)

{
  long lVar1;
  char local_b1;
  string res;
  cmAlphaNum local_90;
  string_view text_local;
  cmAlphaNum local_50;
  
  text_local._M_str = (char *)text._M_len;
  text_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&res,&text_local,(allocator<char> *)&local_90);
  for (lVar1 = 8; lVar1 != 0x98; lVar1 = lVar1 + 0x10) {
    cmsys::SystemTools::ReplaceString
              (&res,*(char **)((long)&PTR___cxa_pure_virtual_00857a30 + lVar1),
               *(char **)((long)&Quoted[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)
                                 ::replacements + lVar1));
  }
  local_90.View_._M_str = local_90.Digits_;
  local_90.View_._M_len = 1;
  local_90.Digits_[0] = '\"';
  local_50.View_._M_len = res._M_string_length;
  local_50.View_._M_str = res._M_dataplus._M_p;
  local_b1 = '\"';
  cmStrCat<char>(__return_storage_ptr__,&local_90,&local_50,&local_b1);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(cm::string_view text)
{
  static std::initializer_list<std::pair<const char*, const char*>> const
    replacements = { { "\\", "\\\\" }, { "\"", "\\\"" }, { "\a", "\\a" },
                     { "\b", "\\b" },  { "\f", "\\f" },  { "\n", "\\n" },
                     { "\r", "\\r" },  { "\t", "\\t" },  { "\v", "\\v" } };

  std::string res(text);
  for (auto const& pair : replacements) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  return cmStrCat('"', res, '"');
}